

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O2

LispPTR N_OP_aref2(LispPTR arrayarg,LispPTR inx0,LispPTR inx1)

{
  uint uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  
  if ((*(ushort *)((ulong)(arrayarg >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 0xf) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  pLVar3 = NativeAligned4FromLAddr(arrayarg);
  uVar1 = *pLVar3;
  if ((inx1 & 0xfff0000) == 0xe0000) {
    LVar6 = inx1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx1 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar4 = NativeAligned4FromLAddr(inx1);
    LVar6 = *pLVar4;
    if ((int)LVar6 < 0) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  LVar2 = pLVar3[4];
  if ((int)LVar2 <= (int)LVar6) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((inx0 & 0xfff0000) == 0xe0000) {
    LVar5 = inx0 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx0 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar4 = NativeAligned4FromLAddr(inx0);
    LVar5 = *pLVar4;
    if ((int)LVar5 < 0) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((int)pLVar3[2] <= (int)LVar5) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  LVar6 = aref_switch((uint)*(byte *)((long)pLVar3 + 6),inx1,uVar1 & 0xfffffff,LVar5 * LVar2 + LVar6
                     );
  return LVar6;
}

Assistant:

LispPTR N_OP_aref2(LispPTR arrayarg, LispPTR inx0, LispPTR inx1) {
  LispPTR baseL;
  int arindex, temp;
  LispArray *arrayblk;
  int j;

  /*  verify array  */
  if (GetTypeNumber(arrayarg) != TYPE_TWOD_ARRAY) ERROR_EXIT(inx1);
  arrayblk = (LispArray *)NativeAligned4FromLAddr(arrayarg);
  baseL = arrayblk->base;

  /*  test and setup index  */
  N_GetPos(inx1, temp, inx1);
  if (temp >= (j = arrayblk->Dim1)) ERROR_EXIT(inx1);
  N_GetPos(inx0, arindex, inx1);
  if (arindex >= arrayblk->Dim0) ERROR_EXIT(inx1);
  arindex *= j;
  arindex += temp;

  /*  disp on type  */
  return (aref_switch(arrayblk->typenumber, inx1, baseL, arindex));
}